

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O0

void down_heap(OPENSSL_STACK *sk,OPENSSL_sk_call_cmp_func call_cmp_func,size_t i,size_t num)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  void *tmp;
  size_t right;
  size_t next;
  size_t left;
  size_t num_local;
  size_t i_local;
  OPENSSL_sk_call_cmp_func call_cmp_func_local;
  OPENSSL_STACK *sk_local;
  
  bVar2 = false;
  if (i < num) {
    bVar2 = num <= sk->num;
  }
  num_local = i;
  if (bVar2) {
    while( true ) {
      sVar4 = left_idx(num_local);
      if (num <= sVar4) {
        return;
      }
      right = num_local;
      iVar3 = (*call_cmp_func)(sk->comp,sk->data[num_local],sk->data[sVar4]);
      if (iVar3 < 0) {
        right = sVar4;
      }
      uVar5 = sVar4 + 1;
      if ((uVar5 < num) &&
         (iVar3 = (*call_cmp_func)(sk->comp,sk->data[right],sk->data[uVar5]), iVar3 < 0)) {
        right = uVar5;
      }
      if (num_local == right) break;
      pvVar1 = sk->data[num_local];
      sk->data[num_local] = sk->data[right];
      sk->data[right] = pvVar1;
      num_local = right;
    }
    return;
  }
  __assert_fail("i < num && num <= sk->num",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                ,0x173,"void down_heap(OPENSSL_STACK *, OPENSSL_sk_call_cmp_func, size_t, size_t)");
}

Assistant:

static void down_heap(OPENSSL_STACK *sk, OPENSSL_sk_call_cmp_func call_cmp_func,
                      size_t i, size_t num) {
  assert(i < num && num <= sk->num);
  for (;;) {
    size_t left = left_idx(i);
    if (left >= num) {
      break;  // No left child.
    }

    // Swap |i| with the largest of its children.
    size_t next = i;
    if (call_cmp_func(sk->comp, sk->data[next], sk->data[left]) < 0) {
      next = left;
    }
    size_t right = left + 1;  // Cannot overflow because |left < num|.
    if (right < num &&
        call_cmp_func(sk->comp, sk->data[next], sk->data[right]) < 0) {
      next = right;
    }

    if (i == next) {
      break;  // |i| is already larger than its children.
    }

    void *tmp = sk->data[i];
    sk->data[i] = sk->data[next];
    sk->data[next] = tmp;
    i = next;
  }
}